

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildLogicalOp(int nToken,CNscPStackEntry *pLhs,CNscPStackEntry *pRhs)

{
  bool bVar1;
  int iVar2;
  CNscPStackEntry *this;
  char *pcVar3;
  NscPCode nCode;
  uint uVar4;
  NscType nType;
  uint local_34;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pLhs != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pLhs->m_link,&g_pCtx->m_listEntryFree);
    }
    if (pRhs != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pRhs->m_link,&g_pCtx->m_listEntryFree);
    }
    CNscPStackEntry::SetType(this,NscType_Unknown);
    return this;
  }
  if (pLhs == (CNscPStackEntry *)0x0) {
    __assert_fail("pLhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x107c,
                  "CNscPStackEntry *NscBuildLogicalOp(int, CNscPStackEntry *, CNscPStackEntry *)");
  }
  if (pRhs == (CNscPStackEntry *)0x0) {
    __assert_fail("pRhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x107d,
                  "CNscPStackEntry *NscBuildLogicalOp(int, CNscPStackEntry *, CNscPStackEntry *)");
  }
  nType = NscType_Error;
  if (pRhs->m_nType == NscType_Error || pLhs->m_nType == NscType_Error) goto LAB_0015d386;
  if (nToken == 0x118) {
    nCode = NscPCode_LogicalAND;
    pcVar3 = "&&";
  }
  else {
    if (nToken != 0x119) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x10a0,
                    "CNscPStackEntry *NscBuildLogicalOp(int, CNscPStackEntry *, CNscPStackEntry *)")
      ;
    }
    nCode = NscPCode_LogicalOR;
    pcVar3 = "||";
  }
  if (pRhs->m_nType != NscType_Integer || pLhs->m_nType != NscType_Integer) {
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,pcVar3);
    goto LAB_0015d386;
  }
  if (g_pCtx->m_fOptExpression == true) {
    bVar1 = CNscPStackEntry::IsSimpleConstant(pLhs);
    uVar4 = 0xffffffff;
    local_34 = 0xffffffff;
    if (bVar1) {
      iVar2 = CNscPStackEntry::GetInteger(pLhs);
      uVar4 = (uint)(iVar2 != 0);
    }
    bVar1 = CNscPStackEntry::IsSimpleConstant(pRhs);
    if (bVar1) {
      iVar2 = CNscPStackEntry::GetInteger(pRhs);
      local_34 = (uint)(iVar2 != 0);
    }
    if (uVar4 == 0xffffffff) goto LAB_0015d340;
    if (nToken == 0x118 && uVar4 == 0) {
      local_34 = 0;
LAB_0015d37d:
      CNscPStackEntry::PushConstantInteger(this,local_34);
    }
    else {
      if (uVar4 == 1 && nToken == 0x119) {
        local_34 = 1;
        goto LAB_0015d37d;
      }
      if (local_34 != 0xffffffff) goto LAB_0015d37d;
      CNscPStackEntry::AppendData(this,pRhs);
    }
  }
  else {
LAB_0015d340:
    CNscPStackEntry::PushLogicalOp
              (this,nCode,pLhs->m_pauchData,pLhs->m_nDataSize,pRhs->m_pauchData,pRhs->m_nDataSize);
  }
  nType = NscType_Integer;
LAB_0015d386:
  CNscPStackEntry::SetType(this,nType);
  CNwnDoubleLinkList::InsertAfter(&pLhs->m_link,&g_pCtx->m_listEntryFree);
  CNwnDoubleLinkList::InsertAfter(&pRhs->m_link,&g_pCtx->m_listEntryFree);
  return this;
}

Assistant:

YYSTYPE NscBuildLogicalOp (int nToken, YYSTYPE pLhs, YYSTYPE pRhs)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pLhs)
			g_pCtx ->FreePStackEntry (pLhs);
		if (pRhs)
			g_pCtx ->FreePStackEntry (pRhs);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Check for an error
	//

	assert (pLhs);
	assert (pRhs);
	NscType nLhsType = pLhs ->GetType ();
	NscType nRhsType = pRhs ->GetType ();
	if (nLhsType == NscType_Error || nRhsType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we are good
	//

	else
	{

		//
		// Get operator information
		//

		const char *pszOp;
		NscPCode nOp;
		if (nToken == ANDAND)
		{
			pszOp = "&&";
			nOp = NscPCode_LogicalAND;
		}
		else if (nToken == OROR)
		{
			pszOp = "||";
			nOp = NscPCode_LogicalOR;
		}
		else
		{
			pszOp = "&&";
			nOp = NscPCode_LogicalAND;
			assert (false);
		}

		//
		// Process the operator
		//

		if (nLhsType == NscType_Integer && nRhsType == NscType_Integer)
		{

			//
			// Get the constant value of the left and right side
			//

			int nLhsConstant = -1;
			int nRhsConstant = -1;
			if (g_pCtx ->GetOptExpression ())
			{
				if (pLhs ->IsSimpleConstant ())
					nLhsConstant = pLhs ->GetInteger () != 0 ? 1 : 0;
				if (pRhs ->IsSimpleConstant ())
					nRhsConstant = pRhs ->GetInteger () != 0 ? 1 : 0;
			}

			//
			// If the left side is not constant
			//

			if (nLhsConstant == -1)
			{
				pOut ->PushLogicalOp (nOp, 
					pLhs ->GetData (), pLhs ->GetDataSize (),
					pRhs ->GetData (), pRhs ->GetDataSize ());
				pOut ->SetType (NscType_Integer);
			}

			//
			// If the operation is known to be true or false by the lhs
			//

			else if (nToken == ANDAND && nLhsConstant == 0)
			{
				pOut ->PushConstantInteger (0);
				pOut ->SetType (NscType_Integer);
			}
			else if (nToken == OROR && nLhsConstant == 1)
			{
				pOut ->PushConstantInteger (1);
				pOut ->SetType (NscType_Integer);
			}

			//
			// If the operation is known to be true or false by the rhs
			//

			else if (nRhsConstant != -1)
			{
				pOut ->PushConstantInteger (nRhsConstant);
				pOut ->SetType (NscType_Integer);
			}

			//
			// Otherwise, just use the rhs
			//

			else
			{
				pOut ->AppendData (pRhs);
				pOut ->SetType (NscType_Integer);
			}
		}
		else
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, pszOp);
			pOut ->SetType (NscType_Error);
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pLhs);
    g_pCtx ->FreePStackEntry (pRhs);
	return pOut;
}